

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O3

void __thiscall Quest_Context::Quest_Context(Quest_Context *this,Character *character,Quest *quest)

{
  _Rb_tree_header *p_Var1;
  
  EOPlus::Context::Context(&this->super_Context,quest->quest);
  (this->super_Context)._vptr_Context = (_func_int **)&PTR_BeginState_00201678;
  this->character = character;
  this->quest = quest;
  (this->state_desc)._M_dataplus._M_p = (pointer)&(this->state_desc).field_2;
  (this->state_desc)._M_string_length = 0;
  (this->state_desc).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->dialogs)._M_t._M_impl.super__Rb_tree_header;
  (this->dialogs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dialogs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dialogs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dialogs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dialogs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->progress)._M_t._M_impl.super__Rb_tree_header;
  (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->progress)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Quest_Context::Quest_Context(Character* character, const Quest* quest)
	: Context(quest->GetQuest())
	, character(character)
	, quest(quest)
{ }